

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  uint uVar2;
  xmlNodeSetPtr pxVar3;
  xmlChar *pxVar4;
  xmlNodeSetPtr pxVar5;
  xmlXPathObjectPtr pxVar6;
  long lVar7;
  int iVar8;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar8 = ctxt->valueNr;
    if ((long)iVar8 < 1) {
      iVar8 = 0x17;
    }
    else {
      uVar2 = iVar8 - 1;
      ctxt->valueNr = uVar2;
      ppxVar1 = ctxt->valueTab;
      if (iVar8 == 1) {
        pxVar6 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar6 = ppxVar1[(long)iVar8 + -2];
      }
      ctxt->value = pxVar6;
      pxVar6 = ppxVar1[uVar2];
      ppxVar1[uVar2] = (xmlXPathObjectPtr)0x0;
      if (pxVar6 != (xmlXPathObjectPtr)0x0) {
        if ((pxVar6->type | XPATH_USERS) == XPATH_XSLT_TREE) {
          pxVar3 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
          if (pxVar3 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          else {
            pxVar3->nodeNr = 0;
            pxVar3->nodeMax = 0;
            pxVar3->nodeTab = (xmlNodePtr *)0x0;
          }
          pxVar5 = pxVar6->nodesetval;
          if ((pxVar5 != (xmlNodeSetPtr)0x0) && (0 < pxVar5->nodeNr)) {
            lVar7 = 0;
            do {
              pxVar4 = xmlNodeGetContent(pxVar5->nodeTab[lVar7]);
              if (pxVar4 == (xmlChar *)0x0) {
                xmlXPathPErrMemory(ctxt);
LAB_001be9bb:
                xmlXPathPErrMemory(ctxt);
                if (pxVar3 == (xmlNodeSetPtr)0x0) {
                  pxVar3 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
                  if (pxVar3 == (xmlNodeSetPtr)0x0) {
                    pxVar5 = (xmlNodeSetPtr)0x0;
                    goto LAB_001be9ec;
                  }
                  pxVar3->nodeNr = 0;
                  pxVar3->nodeMax = 0;
                  pxVar3->nodeTab = (xmlNodePtr *)0x0;
                }
                pxVar5 = (xmlNodeSetPtr)0x0;
LAB_001be9f7:
                xmlXPathFreeNodeSet(pxVar5);
                if (pxVar4 != (xmlChar *)0x0) goto LAB_001bea04;
              }
              else {
                pxVar5 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar4);
                if (pxVar5 == (xmlNodeSetPtr)0x0) goto LAB_001be9bb;
                pxVar3 = xmlXPathNodeSetMerge(pxVar3,pxVar5);
                if (pxVar3 == (xmlNodeSetPtr)0x0) {
LAB_001be9ec:
                  xmlXPathPErrMemory(ctxt);
                  pxVar3 = (xmlNodeSetPtr)0x0;
                  goto LAB_001be9f7;
                }
                xmlXPathFreeNodeSet(pxVar5);
LAB_001bea04:
                (*xmlFree)(pxVar4);
              }
              lVar7 = lVar7 + 1;
              pxVar5 = pxVar6->nodesetval;
            } while (lVar7 < pxVar5->nodeNr);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar6);
          pxVar6 = xmlXPathCacheWrapNodeSet(ctxt,pxVar3);
        }
        else {
          pxVar4 = xmlXPathCastToString(pxVar6);
          if (pxVar4 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar6);
          pxVar3 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar4);
          if (pxVar3 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
            (*xmlFree)(pxVar4);
            pxVar3 = (xmlNodeSetPtr)0x0;
          }
          else {
            (*xmlFree)(pxVar4);
          }
          pxVar6 = xmlXPathCacheWrapNodeSet(ctxt,pxVar3);
        }
        xmlXPathValuePush(ctxt,pxVar6);
        return;
      }
      iVar8 = 10;
    }
  }
  else {
    iVar8 = 0xc;
  }
  xmlXPathErr(ctxt,iVar8);
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = xmlXPathValuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

	ret = xmlXPathNodeSetCreate(NULL);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
                if (tokens == NULL)
                    xmlXPathPErrMemory(ctxt);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                if (ns == NULL)
                    xmlXPathPErrMemory(ctxt);
		ret = xmlXPathNodeSetMerge(ret, ns);
                if (ret == NULL)
                    xmlXPathPErrMemory(ctxt);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
	return;
    }
    tokens = xmlXPathCastToString(obj);
    if (tokens == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlXPathReleaseObject(ctxt->context, obj);
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlFree(tokens);
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
}